

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int dump_inserted_event_fn(event_base *base,event *e,void *arg)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long local_68;
  timeval tv;
  char *gloss;
  FILE *output;
  void *arg_local;
  event *e_local;
  event_base *base_local;
  
  pcVar1 = "fd ";
  if ((e->ev_events & 8U) != 0) {
    pcVar1 = "sig";
  }
  if (((e->ev_evcallback).evcb_flags & 3U) != 0) {
    pcVar4 = anon_var_dwarf_36a810 + 9;
    if ((e->ev_events & 2U) != 0) {
      pcVar4 = " Read";
    }
    pcVar8 = anon_var_dwarf_36a810 + 9;
    if ((e->ev_events & 4U) != 0) {
      pcVar8 = " Write";
    }
    pcVar7 = anon_var_dwarf_36a810 + 9;
    if ((e->ev_events & 0x80U) != 0) {
      pcVar7 = " EOF";
    }
    pcVar3 = anon_var_dwarf_36a810 + 9;
    if ((e->ev_events & 8U) != 0) {
      pcVar3 = " Signal";
    }
    pcVar6 = anon_var_dwarf_36a810 + 9;
    if ((e->ev_events & 0x10U) != 0) {
      pcVar6 = " Persist";
    }
    pcVar5 = anon_var_dwarf_36a810 + 9;
    if ((e->ev_events & 0x20U) != 0) {
      pcVar5 = " ET";
    }
    pcVar2 = anon_var_dwarf_36a810 + 9;
    if (((e->ev_evcallback).evcb_flags & 0x10U) != 0) {
      pcVar2 = " Internal";
    }
    fprintf((FILE *)arg,"  %p [%s %d]%s%s%s%s%s%s%s",e,pcVar1,(ulong)(uint)e->ev_fd,pcVar4,pcVar8,
            pcVar7,pcVar3,pcVar6,pcVar5,pcVar2);
    if (((e->ev_evcallback).evcb_flags & 1U) != 0) {
      local_68 = (e->ev_timeout).tv_sec + (base->tv_clock_diff).tv_sec;
      tv.tv_sec = ((e->ev_timeout).tv_usec & 0xfffffU) + (base->tv_clock_diff).tv_usec;
      if (999999 < tv.tv_sec) {
        local_68 = local_68 + 1;
        tv.tv_sec = tv.tv_sec + -1000000;
      }
      fprintf((FILE *)arg," Timeout=%ld.%06d",local_68,(ulong)((uint)tv.tv_sec & 0xfffff));
    }
    fputc(10,(FILE *)arg);
  }
  return 0;
}

Assistant:

static int
dump_inserted_event_fn(const struct event_base *base, const struct event *e, void *arg)
{
	FILE *output = arg;
	const char *gloss = (e->ev_events & EV_SIGNAL) ?
	    "sig" : "fd ";

	if (! (e->ev_flags & (EVLIST_INSERTED|EVLIST_TIMEOUT)))
		return 0;

	fprintf(output, "  %p [%s "EV_SOCK_FMT"]%s%s%s%s%s%s%s",
	    (void*)e, gloss, EV_SOCK_ARG(e->ev_fd),
	    (e->ev_events&EV_READ)?" Read":"",
	    (e->ev_events&EV_WRITE)?" Write":"",
	    (e->ev_events&EV_CLOSED)?" EOF":"",
	    (e->ev_events&EV_SIGNAL)?" Signal":"",
	    (e->ev_events&EV_PERSIST)?" Persist":"",
	    (e->ev_events&EV_ET)?" ET":"",
	    (e->ev_flags&EVLIST_INTERNAL)?" Internal":"");
	if (e->ev_flags & EVLIST_TIMEOUT) {
		struct timeval tv;
		tv.tv_sec = e->ev_timeout.tv_sec;
		tv.tv_usec = e->ev_timeout.tv_usec & MICROSECONDS_MASK;
		evutil_timeradd(&tv, &base->tv_clock_diff, &tv);
		fprintf(output, " Timeout=%ld.%06d",
		    (long)tv.tv_sec, (int)(tv.tv_usec & MICROSECONDS_MASK));
	}
	fputc('\n', output);

	return 0;
}